

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

void __thiscall wallet::CoinsResult::Shuffle(CoinsResult *this,FastRandomContext *rng_fast)

{
  long lVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (p_Var2 = (this->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->coins)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::
    shuffle<__gnu_cxx::__normal_iterator<wallet::COutput*,std::vector<wallet::COutput,std::allocator<wallet::COutput>>>,FastRandomContext&>
              ((COutput *)p_Var2[1]._M_parent,(COutput *)p_Var2[1]._M_left,rng_fast);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CoinsResult::Shuffle(FastRandomContext& rng_fast)
{
    for (auto& it : coins) {
        std::shuffle(it.second.begin(), it.second.end(), rng_fast);
    }
}